

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int ARKodePrintAllStats(void *arkode_mem,FILE *outfile,SUNOutputFormat fmt)

{
  int iVar1;
  long lVar2;
  int error_code;
  char *pcVar3;
  
  if (arkode_mem == (void *)0x0) {
    pcVar3 = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0xa9d;
LAB_00134bad:
    arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodePrintAllStats",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,pcVar3);
  }
  else {
    if (fmt == SUN_OUTPUTFORMAT_CSV) {
      fprintf((FILE *)outfile,"Time,%.16g",*(undefined8 *)((long)arkode_mem + 0x2d0));
      fprintf((FILE *)outfile,",Steps,%ld",*(undefined8 *)((long)arkode_mem + 0x310));
      fprintf((FILE *)outfile,",Step attempts,%ld",*(undefined8 *)((long)arkode_mem + 0x308));
      fprintf((FILE *)outfile,",Stability limited steps,%ld",
              *(undefined8 *)(*(long *)((long)arkode_mem + 0x2e8) + 0x90));
      fprintf((FILE *)outfile,",Accuracy limited steps,%ld",
              *(undefined8 *)(*(long *)((long)arkode_mem + 0x2e8) + 0x88));
      fprintf((FILE *)outfile,",Error test fails,%ld",*(undefined8 *)((long)arkode_mem + 0x328));
      fprintf((FILE *)outfile,",NLS step fails,%ld",*(undefined8 *)((long)arkode_mem + 800));
      fprintf((FILE *)outfile,",Inequality constraint fails,%ld",
              *(undefined8 *)((long)arkode_mem + 0x330));
      fprintf((FILE *)outfile,",Initial step size,%.16g",*(undefined8 *)((long)arkode_mem + 0x358));
      fprintf((FILE *)outfile,",Last step size,%.16g",*(undefined8 *)((long)arkode_mem + 0x370));
      fprintf((FILE *)outfile,",Current step size,%.16g",*(undefined8 *)((long)arkode_mem + 0x2c0));
      lVar2 = *(long *)((long)arkode_mem + 0x3a0);
      if (lVar2 != 0) {
        pcVar3 = ",Roof fn evals,%ld";
LAB_00134b3e:
        fprintf((FILE *)outfile,pcVar3,*(undefined8 *)(lVar2 + 0x68));
      }
    }
    else {
      if (fmt != SUN_OUTPUTFORMAT_TABLE) {
        pcVar3 = "Invalid formatting option.";
        error_code = -0x16;
        iVar1 = 0xad0;
        goto LAB_00134bad;
      }
      fprintf((FILE *)outfile,"Current time                 = %.16g\n",
              *(undefined8 *)((long)arkode_mem + 0x2d0));
      fprintf((FILE *)outfile,"Steps                        = %ld\n",
              *(undefined8 *)((long)arkode_mem + 0x310));
      fprintf((FILE *)outfile,"Step attempts                = %ld\n",
              *(undefined8 *)((long)arkode_mem + 0x308));
      fprintf((FILE *)outfile,"Stability limited steps      = %ld\n",
              *(undefined8 *)(*(long *)((long)arkode_mem + 0x2e8) + 0x90));
      fprintf((FILE *)outfile,"Accuracy limited steps       = %ld\n",
              *(undefined8 *)(*(long *)((long)arkode_mem + 0x2e8) + 0x88));
      fprintf((FILE *)outfile,"Error test fails             = %ld\n",
              *(undefined8 *)((long)arkode_mem + 0x328));
      fprintf((FILE *)outfile,"NLS step fails               = %ld\n",
              *(undefined8 *)((long)arkode_mem + 800));
      fprintf((FILE *)outfile,"Inequality constraint fails  = %ld\n",
              *(undefined8 *)((long)arkode_mem + 0x330));
      fprintf((FILE *)outfile,"Initial step size            = %.16g\n",
              *(undefined8 *)((long)arkode_mem + 0x358));
      fprintf((FILE *)outfile,"Last step size               = %.16g\n",
              *(undefined8 *)((long)arkode_mem + 0x370));
      fprintf((FILE *)outfile,"Current step size            = %.16g\n",
              *(undefined8 *)((long)arkode_mem + 0x2c0));
      lVar2 = *(long *)((long)arkode_mem + 0x3a0);
      if (lVar2 != 0) {
        pcVar3 = "Root fn evals                = %ld\n";
        goto LAB_00134b3e;
      }
    }
    if ((*(int *)((long)arkode_mem + 0x3a8) != 0) &&
       (iVar1 = arkRelaxPrintAllStats(arkode_mem,outfile,fmt), iVar1 != 0)) {
      return iVar1;
    }
    if (*(code **)((long)arkode_mem + 0xb0) != (code *)0x0) {
      iVar1 = (**(code **)((long)arkode_mem + 0xb0))(arkode_mem,outfile,fmt);
      return iVar1;
    }
    error_code = 0;
  }
  return error_code;
}

Assistant:

int ARKodePrintAllStats(void* arkode_mem, FILE* outfile, SUNOutputFormat fmt)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeRootMem ark_root_mem;

  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  switch (fmt)
  {
  case SUN_OUTPUTFORMAT_TABLE:
    fprintf(outfile, "Current time                 = %" RSYM "\n", ark_mem->tcur);
    fprintf(outfile, "Steps                        = %ld\n", ark_mem->nst);
    fprintf(outfile, "Step attempts                = %ld\n",
            ark_mem->nst_attempts);
    fprintf(outfile, "Stability limited steps      = %ld\n",
            ark_mem->hadapt_mem->nst_exp);
    fprintf(outfile, "Accuracy limited steps       = %ld\n",
            ark_mem->hadapt_mem->nst_acc);
    fprintf(outfile, "Error test fails             = %ld\n", ark_mem->netf);
    fprintf(outfile, "NLS step fails               = %ld\n", ark_mem->ncfn);
    fprintf(outfile, "Inequality constraint fails  = %ld\n",
            ark_mem->nconstrfails);
    fprintf(outfile, "Initial step size            = %" RSYM "\n", ark_mem->h0u);
    fprintf(outfile, "Last step size               = %" RSYM "\n", ark_mem->hold);
    fprintf(outfile, "Current step size            = %" RSYM "\n",
            ark_mem->next_h);
    if (ark_mem->root_mem)
    {
      ark_root_mem = (ARKodeRootMem)ark_mem->root_mem;
      fprintf(outfile, "Root fn evals                = %ld\n", ark_root_mem->nge);
    }
    break;
  case SUN_OUTPUTFORMAT_CSV:
    fprintf(outfile, "Time,%" RSYM, ark_mem->tcur);
    fprintf(outfile, ",Steps,%ld", ark_mem->nst);
    fprintf(outfile, ",Step attempts,%ld", ark_mem->nst_attempts);
    fprintf(outfile, ",Stability limited steps,%ld",
            ark_mem->hadapt_mem->nst_exp);
    fprintf(outfile, ",Accuracy limited steps,%ld", ark_mem->hadapt_mem->nst_acc);
    fprintf(outfile, ",Error test fails,%ld", ark_mem->netf);
    fprintf(outfile, ",NLS step fails,%ld", ark_mem->ncfn);
    fprintf(outfile, ",Inequality constraint fails,%ld", ark_mem->nconstrfails);
    fprintf(outfile, ",Initial step size,%" RSYM, ark_mem->h0u);
    fprintf(outfile, ",Last step size,%" RSYM, ark_mem->hold);
    fprintf(outfile, ",Current step size,%" RSYM, ark_mem->next_h);
    if (ark_mem->root_mem)
    {
      ark_root_mem = (ARKodeRootMem)ark_mem->root_mem;
      fprintf(outfile, ",Roof fn evals,%ld", ark_root_mem->nge);
    }
    break;
  default:
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Invalid formatting option.");
    return (ARK_ILL_INPUT);
  }

  /* Print relaxation stats */
  if (ark_mem->relax_enabled)
  {
    retval = arkRelaxPrintAllStats(ark_mem, outfile, fmt);
    if (retval != ARK_SUCCESS) { return (retval); }
  }

  /* Print stepper stats (if provided) */
  if (ark_mem->step_printallstats)
  {
    return (ark_mem->step_printallstats(ark_mem, outfile, fmt));
  }

  return (ARK_SUCCESS);
}